

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O1

void piga_host_update(piga_host *host)

{
  piga_event_consumer_registered *ev;
  piga_event_consumer_unregistered *ev_00;
  int iVar1;
  
  iVar1 = piga_event_queue_poll(host->host_queue,host->cache_event);
  if (iVar1 == 0) {
    do {
      iVar1 = piga_event_get_type(host->cache_event);
      if (iVar1 == 0x200) {
        ev_00 = (piga_event_consumer_unregistered *)
                piga_event_get_consumer_unregistered(host->cache_event);
        piga_clients_map_remove_from_ev(&host->clients_map,ev_00);
      }
      else if (iVar1 == 0x100) {
        ev = (piga_event_consumer_registered *)piga_event_get_consumer_registered(host->cache_event)
        ;
        piga_clients_map_add_from_ev(&host->clients_map,ev);
      }
      iVar1 = piga_event_queue_poll(host->host_queue,host->cache_event);
    } while (iVar1 == 0);
  }
  return;
}

Assistant:

void piga_host_update(piga_host* host)
{
    while(piga_event_queue_poll(host->host_queue, host->cache_event) == PIGA_STATUS_OK) {
        switch(piga_event_get_type(host->cache_event)) {
            case PIGA_EVENT_CONSUMER_REGISTERED:
                piga_clients_map_add_from_ev(&host->clients_map, 
                    piga_event_get_consumer_registered(host->cache_event));
                break;
            case PIGA_EVENT_CONSUMER_UNREGISTERED:
                piga_clients_map_remove_from_ev(&host->clients_map,
                    piga_event_get_consumer_unregistered(host->cache_event));
                break;
            case PIGA_EVENT_APP_INSTALLED:
                break;
            case PIGA_EVENT_GAME_INPUT:
                break;
            case PIGA_EVENT_PLAYER_JOINED:
                break;
            case PIGA_EVENT_PLAYER_LEFT:
                break;
            case PIGA_EVENT_REQUEST_KEYBOARD:
                break;
            case PIGA_EVENT_REQUEST_RESTART:
                break;
            case PIGA_EVENT_TEXT_INPUT:
                break;
            case PIGA_EVENT_PLUGIN_MSG:
                break;
            case PIGA_EVENT_UNKNOWN:
                break;
            }
        }
    }